

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_0::DummyService::request
          (DummyService *this,HttpMethod method,StringPtr url,HttpHeaders *headers,
          AsyncInputStream *requestBody,Response *response)

{
  ArrayDisposer *pAVar1;
  undefined8 uVar2;
  long *plVar3;
  WebSocket *pWVar4;
  size_t sVar5;
  char *pcVar6;
  bool bVar7;
  Promise<void> *pPVar8;
  uint uVar9;
  uint *puVar10;
  undefined1 *puVar11;
  PromiseNode *pPVar12;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *extraout_RDX_02;
  PromiseNode *extraout_RDX_03;
  HttpHeaderTable *pHVar13;
  PromiseNode *extraout_RDX_04;
  PromiseNode *extraout_RDX_05;
  PromiseNode *extraout_RDX_06;
  PromiseNode *extraout_RDX_07;
  PromiseNode *extraout_RDX_08;
  PromiseNode *extraout_RDX_09;
  undefined4 in_register_00000034;
  Array<kj::Promise<void>_> *pAVar14;
  HttpHeaders *params_2;
  Promise<void> PVar15;
  Own<kj::_::TransformPromiseNode<kj::_::Void,_kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj____kj_async_h:195:68),_kj::_::PropagateException>_>
  OVar16;
  Own<kj::_::TransformPromiseNode<kj::_::Void,_kj::Array<unsigned_char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj____kj_async_h:195:68),_kj::_::PropagateException>_>
  OVar17;
  long *in_stack_00000010;
  Promise<void> sendPromise;
  Own<kj::WebSocket> ws;
  Array<kj::Promise<void>_> result;
  String body;
  ArrayBuilder<kj::Promise<void>_> promises;
  PropagateException local_241;
  undefined1 local_240 [24];
  long *local_228;
  Own<kj::WebSocket> local_220;
  Array<kj::Promise<void>_> local_208;
  String local_1e8;
  String local_1c8;
  uint *local_1a8;
  HttpHeaders *local_1a0;
  Exception local_198;
  undefined1 local_40 [8];
  undefined1 *local_38;
  
  puVar10 = (uint *)url.content.size_;
  params_2 = headers;
  local_1a8 = puVar10;
  local_1a0 = headers;
  bVar7 = HttpHeaders::isWebSocket((HttpHeaders *)requestBody);
  if (bVar7) {
    HttpHeaders::HttpHeaders
              ((HttpHeaders *)&local_198,
               *(HttpHeaderTable **)(CONCAT44(in_register_00000034,method) + 8));
    (**(code **)(*in_stack_00000010 + 8))(local_240 + 0x10,in_stack_00000010,&local_198);
    HttpHeaders::~HttpHeaders((HttpHeaders *)&local_198);
    pAVar1 = (ArrayDisposer *)requestBody[1]._vptr_AsyncInputStream[0x17];
    bVar7 = (ArrayDisposer *)0x1 < pAVar1;
    if (bVar7) {
      local_198.ownFile.content.size_ = (size_t)requestBody[1]._vptr_AsyncInputStream[0x16];
      local_198.ownFile.content.disposer = pAVar1;
    }
    local_198.ownFile.content.ptr = (char *)CONCAT71(local_198.ownFile.content.ptr._1_7_,bVar7);
    local_208.ptr = (Promise<void> *)0x38bc0a;
    local_208.size_ = 5;
    pAVar14 = &local_208;
    if (bVar7) {
      pAVar14 = (Array<kj::Promise<void>_> *)&local_198.ownFile.content.size_;
    }
    str<kj::StringPtr,char_const(&)[2],kj::StringPtr&>
              (&local_1e8,(kj *)pAVar14,(StringPtr *)0x3aed25,(char (*) [2])&local_1a8,
               (StringPtr *)params_2);
    pHVar13 = (HttpHeaderTable *)local_1e8.content.size_;
    if ((HttpHeaderTable *)local_1e8.content.size_ != (HttpHeaderTable *)0x0) {
      pHVar13 = (HttpHeaderTable *)local_1e8.content.ptr;
    }
    (**(code **)(*local_228 + 8))(local_240,local_228,pHVar13);
    pPVar8 = (Promise<void> *)
             _::HeapArrayDisposer::allocateImpl
                       (0x10,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_198.file = (char *)&_::HeapArrayDisposer::instance;
    local_198.ownFile.content.ptr = (char *)pPVar8;
    local_198.ownFile.content.size_ = (size_t)pPVar8;
    local_198.ownFile.content.disposer = (ArrayDisposer *)(pPVar8 + 2);
    PVar15 = Promise<void>::attach<kj::String>((Promise<void> *)&local_208,(String *)local_240);
    *(undefined4 *)&(pPVar8->super_PromiseBase).node.disposer = local_208.ptr._0_4_;
    *(undefined4 *)((long)&(pPVar8->super_PromiseBase).node.disposer + 4) = local_208.ptr._4_4_;
    *(undefined4 *)&(pPVar8->super_PromiseBase).node.ptr = (undefined4)local_208.size_;
    *(undefined4 *)((long)&(pPVar8->super_PromiseBase).node.ptr + 4) = local_208.size_._4_4_;
    local_198.ownFile.content.size_ = (size_t)(pPVar8 + 1);
    (**(code **)(*local_228 + 0x30))(&local_220,local_228,PVar15.super_PromiseBase.node.ptr);
    OVar16 = heap<kj::_::TransformPromiseNode<kj::_::Void,kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>,kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>::ignoreResult()::_lambda(kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>&&)_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>::ignoreResult()::_lambda(kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>&&)_1_,kj::_::PropagateException>
                       ((Own<kj::_::PromiseNode> *)&local_208,
                        (anon_class_1_0_00000001_for_func *)&local_220,&local_241);
    pWVar4 = local_220.ptr;
    *(undefined4 *)&pPVar8[1].super_PromiseBase.node.disposer = local_208.ptr._0_4_;
    *(undefined4 *)((long)&pPVar8[1].super_PromiseBase.node.disposer + 4) = local_208.ptr._4_4_;
    *(undefined4 *)&pPVar8[1].super_PromiseBase.node.ptr = (undefined4)local_208.size_;
    *(undefined4 *)((long)&pPVar8[1].super_PromiseBase.node.ptr + 4) = local_208.size_._4_4_;
    if (local_220.ptr != (WebSocket *)0x0) {
      local_220.ptr = (WebSocket *)0x0;
      local_198.ownFile.content.size_ = (size_t)(pPVar8 + 2);
      (**(local_220.disposer)->_vptr_Disposer)
                (local_220.disposer,
                 (_func_int *)((long)&pWVar4->_vptr_WebSocket + (long)pWVar4->_vptr_WebSocket[-2]),
                 OVar16.ptr);
    }
    local_208.size_ = 2;
    local_208.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    local_198.ownFile.content.ptr = (char *)0x0;
    local_198.ownFile.content.size_ = 0;
    local_198.ownFile.content.disposer = (ArrayDisposer *)0x0;
    local_208.ptr = pPVar8;
    joinPromises((kj *)&local_220,&local_208);
    PVar15 = Promise<void>::attach<kj::Own<kj::WebSocket>>((Promise<void> *)this,&local_220);
    pWVar4 = local_220.ptr;
    pPVar12 = PVar15.super_PromiseBase.node.ptr;
    if (local_220.ptr != (WebSocket *)0x0) {
      local_220.ptr = (WebSocket *)0x0;
      (**(local_220.disposer)->_vptr_Disposer)
                (local_220.disposer,
                 (_func_int *)((long)&pWVar4->_vptr_WebSocket + (long)pWVar4->_vptr_WebSocket[-2]));
      pPVar12 = extraout_RDX;
    }
    sVar5 = local_208.size_;
    pPVar8 = local_208.ptr;
    if (local_208.ptr != (Promise<void> *)0x0) {
      local_208.ptr = (Promise<void> *)0x0;
      local_208.size_ = 0;
      (**(local_208.disposer)->_vptr_ArrayDisposer)
                (local_208.disposer,pPVar8,0x10,sVar5,sVar5,
                 ArrayDisposer::Dispose_<kj::Promise<void>,_false>::destruct);
      pPVar12 = extraout_RDX_00;
    }
    uVar2 = local_240._8_8_;
    if ((AsyncOutputStream *)local_240._8_8_ != (AsyncOutputStream *)0x0) {
      local_240._8_8_ = (AsyncOutputStream *)0x0;
      (**(code **)*(_func_int **)local_240._0_8_)
                (local_240._0_8_,
                 (_func_int *)((long)(_func_int ***)uVar2 + (long)(*(_func_int ***)uVar2)[-2]));
      pPVar12 = extraout_RDX_01;
    }
    sVar5 = local_1e8.content.size_;
    pcVar6 = local_1e8.content.ptr;
    if ((HttpHeaderTable *)local_1e8.content.ptr != (HttpHeaderTable *)0x0) {
      local_1e8.content.ptr = (char *)0x0;
      local_1e8.content.size_ = 0;
      (**(local_1e8.content.disposer)->_vptr_ArrayDisposer)
                (local_1e8.content.disposer,pcVar6,1,sVar5,sVar5,0);
      pPVar12 = extraout_RDX_02;
    }
    plVar3 = local_228;
    if (local_228 != (long *)0x0) {
      local_228 = (long *)0x0;
      (***(_func_int ***)local_240._16_8_)
                (local_240._16_8_,(long)plVar3 + *(long *)(*plVar3 + -0x10));
      pPVar12 = extraout_RDX_03;
    }
  }
  else if ((headers == (HttpHeaders *)0x7) &&
          (uVar9 = (ushort)puVar10[1] ^ 0x776f | *puVar10 ^ 0x7268742f, uVar9 == 0)) {
    _::Debug::makeDescription<char_const(&)[25]>
              (&local_1c8,(Debug *)"\"client requested failure\"","client requested failure",
               (char (*) [25])(ulong)uVar9);
    Exception::Exception
              (&local_198,FAILED,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0xb37,&local_1c8);
    heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>((kj *)&local_1e8,&local_198);
    (this->super_HttpService)._vptr_HttpService = (_func_int **)local_1e8.content.ptr;
    this->headerTable = (HttpHeaderTable *)local_1e8.content.size_;
    Exception::~Exception(&local_198);
    sVar5 = local_1c8.content.size_;
    pcVar6 = local_1c8.content.ptr;
    pPVar12 = extraout_RDX_08;
    if (local_1c8.content.ptr != (char *)0x0) {
      local_1c8.content.ptr = (char *)0x0;
      local_1c8.content.size_ = 0;
      (**(local_1c8.content.disposer)->_vptr_ArrayDisposer)
                (local_1c8.content.disposer,pcVar6,1,sVar5,sVar5,0);
      pPVar12 = extraout_RDX_09;
    }
  }
  else {
    pAVar1 = (ArrayDisposer *)requestBody[1]._vptr_AsyncInputStream[0x17];
    bVar7 = (ArrayDisposer *)0x1 < pAVar1;
    if (bVar7) {
      local_198.ownFile.content.size_ = (size_t)requestBody[1]._vptr_AsyncInputStream[0x16];
      local_198.ownFile.content.disposer = pAVar1;
    }
    local_198.ownFile.content.ptr = (char *)CONCAT71(local_198.ownFile.content.ptr._1_7_,bVar7);
    local_208.ptr = (Promise<void> *)0x38bc0a;
    local_208.size_ = 5;
    pAVar14 = &local_208;
    if (bVar7) {
      pAVar14 = (Array<kj::Promise<void>_> *)&local_198.ownFile.content.size_;
    }
    str<kj::StringPtr,char_const(&)[2],kj::StringPtr&>
              (&local_1e8,(kj *)pAVar14,(StringPtr *)0x3aed25,(char (*) [2])&local_1a8,
               (StringPtr *)params_2);
    HttpHeaders::HttpHeaders
              ((HttpHeaders *)&local_198,
               *(HttpHeaderTable **)(CONCAT44(in_register_00000034,method) + 8));
    local_38 = (undefined1 *)0x0;
    if ((HttpHeaderTable *)local_1e8.content.size_ != (HttpHeaderTable *)0x0) {
      local_38 = (undefined1 *)
                 ((long)&(((HttpHeaderTable *)(local_1e8.content.size_ + -0x30))->idsByName).ptr + 7
                 );
    }
    local_40[0] = 1;
    (**(code **)*in_stack_00000010)
              (local_240 + 0x10,in_stack_00000010,200,"OK",3,&local_198,local_40);
    HttpHeaders::~HttpHeaders((HttpHeaders *)&local_198);
    pPVar8 = (Promise<void> *)
             _::HeapArrayDisposer::allocateImpl
                       (0x10,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_198.file = (char *)&_::HeapArrayDisposer::instance;
    pHVar13 = (HttpHeaderTable *)local_1e8.content.size_;
    if ((HttpHeaderTable *)local_1e8.content.size_ != (HttpHeaderTable *)0x0) {
      pHVar13 = (HttpHeaderTable *)local_1e8.content.ptr;
    }
    puVar11 = (undefined1 *)0x0;
    if ((HttpHeaderTable *)local_1e8.content.size_ != (HttpHeaderTable *)0x0) {
      puVar11 = (undefined1 *)
                ((long)&(((HttpHeaderTable *)(local_1e8.content.size_ + -0x30))->idsByName).ptr + 7)
      ;
    }
    local_198.ownFile.content.ptr = (char *)pPVar8;
    local_198.ownFile.content.size_ = (size_t)pPVar8;
    local_198.ownFile.content.disposer = (ArrayDisposer *)(pPVar8 + 2);
    (**(code **)*local_228)(&local_208,local_228,pHVar13,puVar11);
    (pPVar8->super_PromiseBase).node.disposer = (Disposer *)local_208.ptr;
    (pPVar8->super_PromiseBase).node.ptr = (PromiseNode *)local_208.size_;
    local_198.ownFile.content.size_ = (size_t)(pPVar8 + 1);
    AsyncInputStream::readAllBytes((AsyncInputStream *)local_240,(uint64_t)response);
    OVar17 = heap<kj::_::TransformPromiseNode<kj::_::Void,kj::Array<unsigned_char>,kj::Promise<kj::Array<unsigned_char>>::ignoreResult()::_lambda(kj::Array<unsigned_char>&&)_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,kj::Promise<kj::Array<unsigned_char>>::ignoreResult()::_lambda(kj::Array<unsigned_char>&&)_1_,kj::_::PropagateException>
                       ((Own<kj::_::PromiseNode> *)&local_208,
                        (anon_class_1_0_00000001_for_func *)local_240,
                        (PropagateException *)&local_220);
    uVar2 = local_240._8_8_;
    *(undefined4 *)&pPVar8[1].super_PromiseBase.node.disposer = local_208.ptr._0_4_;
    *(undefined4 *)((long)&pPVar8[1].super_PromiseBase.node.disposer + 4) = local_208.ptr._4_4_;
    *(undefined4 *)&pPVar8[1].super_PromiseBase.node.ptr = (undefined4)local_208.size_;
    *(undefined4 *)((long)&pPVar8[1].super_PromiseBase.node.ptr + 4) = local_208.size_._4_4_;
    if ((AsyncOutputStream *)local_240._8_8_ != (AsyncOutputStream *)0x0) {
      local_240._8_8_ = (AsyncOutputStream *)0x0;
      local_198.ownFile.content.size_ = (size_t)(pPVar8 + 2);
      (**(code **)*(_func_int **)local_240._0_8_)
                (local_240._0_8_,
                 (_func_int *)((long)(_func_int ***)uVar2 + (long)(*(_func_int ***)uVar2)[-2]),
                 OVar17.ptr);
    }
    local_208.size_ = 2;
    local_208.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    local_198.ownFile.content.ptr = (char *)0x0;
    local_198.ownFile.content.size_ = 0;
    local_198.ownFile.content.disposer = (ArrayDisposer *)0x0;
    local_208.ptr = pPVar8;
    joinPromises((kj *)local_240,&local_208);
    PVar15 = Promise<void>::attach<kj::Own<kj::AsyncOutputStream>,kj::String>
                       ((Promise<void> *)this,(Own<kj::AsyncOutputStream> *)local_240,
                        (String *)(local_240 + 0x10));
    uVar2 = local_240._8_8_;
    pPVar12 = PVar15.super_PromiseBase.node.ptr;
    if ((AsyncOutputStream *)local_240._8_8_ != (AsyncOutputStream *)0x0) {
      local_240._8_8_ = (AsyncOutputStream *)0x0;
      (**(code **)*(_func_int **)local_240._0_8_)
                (local_240._0_8_,
                 (_func_int *)((long)(_func_int ***)uVar2 + (long)(*(_func_int ***)uVar2)[-2]));
      pPVar12 = extraout_RDX_04;
    }
    sVar5 = local_208.size_;
    pPVar8 = local_208.ptr;
    if (local_208.ptr != (Promise<void> *)0x0) {
      local_208.ptr = (Promise<void> *)0x0;
      local_208.size_ = 0;
      (**(local_208.disposer)->_vptr_ArrayDisposer)
                (local_208.disposer,pPVar8,0x10,sVar5,sVar5,
                 ArrayDisposer::Dispose_<kj::Promise<void>,_false>::destruct);
      pPVar12 = extraout_RDX_05;
    }
    plVar3 = local_228;
    if (local_228 != (long *)0x0) {
      local_228 = (long *)0x0;
      (***(_func_int ***)local_240._16_8_)
                (local_240._16_8_,(long)plVar3 + *(long *)(*plVar3 + -0x10));
      pPVar12 = extraout_RDX_06;
    }
    sVar5 = local_1e8.content.size_;
    pcVar6 = local_1e8.content.ptr;
    if ((HttpHeaderTable *)local_1e8.content.ptr != (HttpHeaderTable *)0x0) {
      local_1e8.content.ptr = (char *)0x0;
      local_1e8.content.size_ = 0;
      (**(local_1e8.content.disposer)->_vptr_ArrayDisposer)
                (local_1e8.content.disposer,pcVar6,1,sVar5,sVar5,0);
      pPVar12 = extraout_RDX_07;
    }
  }
  PVar15.super_PromiseBase.node.ptr = pPVar12;
  PVar15.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar15.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> request(
      HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
      kj::AsyncInputStream& requestBody, Response& response) override {
    if (!headers.isWebSocket()) {
      if (url == "/throw") {
        return KJ_EXCEPTION(FAILED, "client requested failure");
      }

      auto body = kj::str(headers.get(HttpHeaderId::HOST).orDefault("null"), ":", url);
      auto stream = response.send(200, "OK", HttpHeaders(headerTable), body.size());
      auto promises = kj::heapArrayBuilder<kj::Promise<void>>(2);
      promises.add(stream->write(body.begin(), body.size()));
      promises.add(requestBody.readAllBytes().ignoreResult());
      return kj::joinPromises(promises.finish()).attach(kj::mv(stream), kj::mv(body));
    } else {
      auto ws = response.acceptWebSocket(HttpHeaders(headerTable));
      auto body = kj::str(headers.get(HttpHeaderId::HOST).orDefault("null"), ":", url);
      auto sendPromise = ws->send(body);

      auto promises = kj::heapArrayBuilder<kj::Promise<void>>(2);
      promises.add(sendPromise.attach(kj::mv(body)));
      promises.add(ws->receive().ignoreResult());
      return kj::joinPromises(promises.finish()).attach(kj::mv(ws));
    }
  }